

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.c
# Opt level: O3

PyObject * libxml_xmlXPathObjectPtrWrap(xmlXPathObjectPtr obj)

{
  xmlNodePtr pxVar1;
  int *piVar2;
  xmlNodeSetPtr pxVar3;
  PyObject *pPVar4;
  _xmlNode *p_Var5;
  undefined *puVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  _xmlNode **pp_Var9;
  long lVar10;
  PyObject *pPVar11;
  long lVar12;
  
  if (obj == (xmlXPathObjectPtr)0x0) {
    __Py_NoneStruct = __Py_NoneStruct + 1;
    return (PyObject *)&_Py_NoneStruct;
  }
  switch(obj->type) {
  case XPATH_NODESET:
    if ((obj->nodesetval == (xmlNodeSetPtr)0x0) || (obj->nodesetval->nodeNr == 0)) {
      pPVar11 = (PyObject *)PyList_New(0);
    }
    else {
      pPVar11 = (PyObject *)PyList_New();
      pxVar3 = obj->nodesetval;
      if (0 < pxVar3->nodeNr) {
        lVar12 = 0;
        do {
          pxVar1 = pxVar3->nodeTab[lVar12];
          if (pxVar1->type == XML_NAMESPACE_DECL) {
            uVar7 = PyCapsule_New(pxVar1,"xmlNsPtr",libxml_xmlXPathDestructNsNode);
            PyList_SetItem(pPVar11,lVar12,uVar7);
            obj->nodesetval->nodeTab[lVar12] = (xmlNodePtr)0x0;
          }
          else {
            uVar7 = PyCapsule_New(pxVar1,"xmlNodePtr",0);
            PyList_SetItem(pPVar11,lVar12,uVar7);
          }
          lVar12 = lVar12 + 1;
          pxVar3 = obj->nodesetval;
        } while (lVar12 < pxVar3->nodeNr);
      }
    }
    break;
  case XPATH_BOOLEAN:
    pPVar11 = (PyObject *)PyLong_FromLong((long)obj->boolval);
    break;
  case XPATH_NUMBER:
    pPVar11 = (PyObject *)PyFloat_FromDouble(obj->floatval);
    break;
  case XPATH_STRING:
    pPVar11 = (PyObject *)PyUnicode_FromString(obj->stringval);
    break;
  case XPATH_POINT:
    if (obj->user == (void *)0x0) {
      puVar6 = &_Py_NoneStruct;
      __Py_NoneStruct = __Py_NoneStruct + 1;
    }
    else {
      puVar6 = (undefined *)PyCapsule_New(obj->user,"xmlNodePtr",0);
    }
    uVar7 = PyLong_FromLong((long)obj->index);
    pPVar11 = (PyObject *)PyTuple_New(2);
    PyTuple_SetItem(pPVar11,0,puVar6);
    PyTuple_SetItem(pPVar11,1,uVar7);
    break;
  case XPATH_RANGE:
    if ((obj->user2 == (void *)0x0) || ((obj->user2 == obj->user && (obj->index == obj->index2)))) {
      pPVar11 = (PyObject *)PyList_New(1);
      if (obj->user == (void *)0x0) {
        puVar6 = &_Py_NoneStruct;
        __Py_NoneStruct = __Py_NoneStruct + 1;
      }
      else {
        puVar6 = (undefined *)PyCapsule_New(obj->user,"xmlNodePtr",0);
      }
      uVar7 = PyLong_FromLong((long)obj->index);
      uVar8 = PyTuple_New(2);
      PyTuple_SetItem(uVar8,0,puVar6);
      PyTuple_SetItem(uVar8,1,uVar7);
      uVar7 = 0;
    }
    else {
      pPVar11 = (PyObject *)PyList_New(2);
      if (obj->user == (void *)0x0) {
        puVar6 = &_Py_NoneStruct;
        __Py_NoneStruct = __Py_NoneStruct + 1;
      }
      else {
        puVar6 = (undefined *)PyCapsule_New(obj->user,"xmlNodePtr",0);
      }
      uVar7 = PyLong_FromLong((long)obj->index);
      uVar8 = PyTuple_New(2);
      PyTuple_SetItem(uVar8,0,puVar6);
      PyTuple_SetItem(uVar8,1,uVar7);
      PyList_SetItem(pPVar11,0,uVar8);
      if (obj->user2 == (void *)0x0) {
        puVar6 = &_Py_NoneStruct;
        __Py_NoneStruct = __Py_NoneStruct + 1;
      }
      else {
        puVar6 = (undefined *)PyCapsule_New(obj->user2,"xmlNodePtr",0);
      }
      uVar7 = PyLong_FromLong((long)obj->index2);
      uVar8 = PyTuple_New(2);
      PyTuple_SetItem(uVar8,0,puVar6);
      PyTuple_SetItem(uVar8,1,uVar7);
      uVar7 = 1;
    }
    PyList_SetItem(pPVar11,uVar7,uVar8);
    break;
  case XPATH_LOCATIONSET:
    piVar2 = (int *)obj->user;
    if ((piVar2 != (int *)0x0) && (0 < *piVar2)) {
      pPVar11 = (PyObject *)PyList_New();
      if (0 < *piVar2) {
        lVar12 = 0;
        do {
          pPVar4 = libxml_xmlXPathObjectPtrWrap
                             (*(xmlXPathObjectPtr *)(*(long *)(piVar2 + 2) + lVar12 * 8));
          *(undefined8 *)(*(long *)(piVar2 + 2) + lVar12 * 8) = 0;
          PyList_SetItem(pPVar11,lVar12,pPVar4);
          lVar12 = lVar12 + 1;
        } while (lVar12 < *piVar2);
      }
      *piVar2 = 0;
      break;
    }
  default:
    pPVar11 = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
    break;
  case XPATH_XSLT_TREE:
    pxVar3 = obj->nodesetval;
    if ((((pxVar3 != (xmlNodeSetPtr)0x0) && (pxVar3->nodeNr != 0)) &&
        (pxVar3->nodeTab != (xmlNodePtr *)0x0)) &&
       (p_Var5 = (*pxVar3->nodeTab)->children, p_Var5 != (_xmlNode *)0x0)) {
      lVar12 = 0;
      do {
        p_Var5 = p_Var5->next;
        lVar12 = lVar12 + 1;
      } while (p_Var5 != (_xmlNode *)0x0);
      pPVar11 = (PyObject *)PyList_New(lVar12);
      pp_Var9 = &(*obj->nodesetval->nodeTab)->children;
      lVar10 = 0;
      do {
        p_Var5 = *pp_Var9;
        if (p_Var5 == (_xmlNode *)0x0) {
          __Py_NoneStruct = __Py_NoneStruct + 1;
          puVar6 = &_Py_NoneStruct;
        }
        else {
          puVar6 = (undefined *)PyCapsule_New(p_Var5,"xmlNodePtr",0);
        }
        PyList_SetItem(pPVar11,lVar10,puVar6);
        pp_Var9 = &p_Var5->next;
        lVar10 = lVar10 + 1;
        lVar12 = lVar12 + -1;
      } while (lVar12 != 0);
      return pPVar11;
    }
    pPVar11 = (PyObject *)PyList_New(0);
    return pPVar11;
  }
  xmlXPathFreeObject(obj);
  return pPVar11;
}

Assistant:

PyObject *
libxml_xmlXPathObjectPtrWrap(xmlXPathObjectPtr obj)
{
    PyObject *ret;

#ifdef DEBUG
    printf("libxml_xmlXPathObjectPtrWrap: ctxt = %p\n", obj);
#endif
    if (obj == NULL) {
        Py_INCREF(Py_None);
        return (Py_None);
    }
    switch (obj->type) {
        case XPATH_XSLT_TREE: {
            if ((obj->nodesetval == NULL) ||
		(obj->nodesetval->nodeNr == 0) ||
		(obj->nodesetval->nodeTab == NULL)) {
                ret = PyList_New(0);
	    } else {
		int i, len = 0;
		xmlNodePtr node;

		node = obj->nodesetval->nodeTab[0]->children;
		while (node != NULL) {
		    len++;
		    node = node->next;
		}
		ret = PyList_New(len);
		node = obj->nodesetval->nodeTab[0]->children;
		for (i = 0;i < len;i++) {
                    PyList_SetItem(ret, i, libxml_xmlNodePtrWrap(node));
		    node = node->next;
		}
	    }
	    /*
	     * Return now, do not free the object passed down
	     */
	    return (ret);
	}
        case XPATH_NODESET:
            if ((obj->nodesetval == NULL)
                || (obj->nodesetval->nodeNr == 0)) {
                ret = PyList_New(0);
	    } else {
                int i;
                xmlNodePtr node;

                ret = PyList_New(obj->nodesetval->nodeNr);
                for (i = 0; i < obj->nodesetval->nodeNr; i++) {
                    node = obj->nodesetval->nodeTab[i];
                    if (node->type == XML_NAMESPACE_DECL) {
		        PyObject *ns = PyCapsule_New((void *) node,
                                     (char *) "xmlNsPtr",
				     libxml_xmlXPathDestructNsNode);
			PyList_SetItem(ret, i, ns);
			/* make sure the xmlNsPtr is not destroyed now */
			obj->nodesetval->nodeTab[i] = NULL;
		    } else {
			PyList_SetItem(ret, i, libxml_xmlNodePtrWrap(node));
		    }
                }
            }
            break;
        case XPATH_BOOLEAN:
            ret = PY_IMPORT_INT((long) obj->boolval);
            break;
        case XPATH_NUMBER:
            ret = PyFloat_FromDouble(obj->floatval);
            break;
        case XPATH_STRING:
	    ret = PY_IMPORT_STRING((char *) obj->stringval);
            break;
        case XPATH_POINT:
        {
            PyObject *node;
            PyObject *indexIntoNode;
            PyObject *tuple;

            node = libxml_xmlNodePtrWrap(obj->user);
            indexIntoNode = PY_IMPORT_INT((long) obj->index);

            tuple = PyTuple_New(2);
            PyTuple_SetItem(tuple, 0, node);
            PyTuple_SetItem(tuple, 1, indexIntoNode);

            ret = tuple;
            break;
        }
        case XPATH_RANGE:
        {
            unsigned short bCollapsedRange;

            bCollapsedRange = ( (obj->user2 == NULL) ||
		                ((obj->user2 == obj->user) && (obj->index == obj->index2)) );
            if ( bCollapsedRange ) {
                PyObject *node;
                PyObject *indexIntoNode;
                PyObject *tuple;
                PyObject *list;

                list = PyList_New(1);

                node = libxml_xmlNodePtrWrap(obj->user);
                indexIntoNode = PY_IMPORT_INT((long) obj->index);

                tuple = PyTuple_New(2);
                PyTuple_SetItem(tuple, 0, node);
                PyTuple_SetItem(tuple, 1, indexIntoNode);

                PyList_SetItem(list, 0, tuple);

                ret = list;
            } else {
                PyObject *node;
                PyObject *indexIntoNode;
                PyObject *tuple;
                PyObject *list;

                list = PyList_New(2);

                node = libxml_xmlNodePtrWrap(obj->user);
                indexIntoNode = PY_IMPORT_INT((long) obj->index);

                tuple = PyTuple_New(2);
                PyTuple_SetItem(tuple, 0, node);
                PyTuple_SetItem(tuple, 1, indexIntoNode);

                PyList_SetItem(list, 0, tuple);

                node = libxml_xmlNodePtrWrap(obj->user2);
                indexIntoNode = PY_IMPORT_INT((long) obj->index2);

                tuple = PyTuple_New(2);
                PyTuple_SetItem(tuple, 0, node);
                PyTuple_SetItem(tuple, 1, indexIntoNode);

                PyList_SetItem(list, 1, tuple);

                ret = list;
            }
            break;
        }
        case XPATH_LOCATIONSET:
        {
            xmlLocationSetPtr set;

            set = obj->user;
            if ( set && set->locNr > 0 ) {
                int i;
                PyObject *list;

                list = PyList_New(set->locNr);

                for (i=0; i<set->locNr; i++) {
                    xmlXPathObjectPtr setobj;
                    PyObject *pyobj;

                    setobj = set->locTab[i]; /*xmlXPathObjectPtr setobj*/

                    pyobj = libxml_xmlXPathObjectPtrWrap(setobj);
                    /* xmlXPathFreeObject(setobj) is called */
                    set->locTab[i] = NULL;

                    PyList_SetItem(list, i, pyobj);
                }
                set->locNr = 0;
                ret = list;
            } else {
                Py_INCREF(Py_None);
                ret = Py_None;
            }
            break;
        }
        default:
#ifdef DEBUG
            printf("Unable to convert XPath object type %d\n", obj->type);
#endif
            Py_INCREF(Py_None);
            ret = Py_None;
    }
    xmlXPathFreeObject(obj);
    return (ret);
}